

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2lax_polygon_shape.cc
# Opt level: O1

Chain __thiscall EncodedS2LaxPolygonShape::chain(EncodedS2LaxPolygonShape *this,int i)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  S2LogMessage SStack_28;
  
  if (i < *(int *)&(this->super_S2Shape).field_0xc) {
    if (*(int *)&(this->super_S2Shape).field_0xc == 1) {
      uVar2 = (this->vertices_).size_;
      uVar3 = 0;
    }
    else {
      uVar1 = s2coding::EncodedUintVector<unsigned_int>::operator[](&this->cumulative_vertices_,i);
      uVar2 = s2coding::EncodedUintVector<unsigned_int>::operator[]
                        (&this->cumulative_vertices_,i + 1);
      uVar2 = uVar2 - uVar1;
      uVar3 = (ulong)uVar1;
    }
    return (Chain)((ulong)uVar2 << 0x20 | uVar3);
  }
  S2LogMessage::S2LogMessage
            (&SStack_28,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2lax_polygon_shape.cc"
             ,0x137,kFatal,(ostream *)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>
            (SStack_28.stream_,"Check failed: (i) < (num_loops()) ",0x22);
  abort();
}

Assistant:

S2Shape::Chain EncodedS2LaxPolygonShape::chain(int i) const {
  S2_DCHECK_LT(i, num_loops());
  if (num_loops() == 1) {
    return Chain(0, vertices_.size());
  } else {
    int start = cumulative_vertices_[i];
    return Chain(start, cumulative_vertices_[i + 1] - start);
  }
}